

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

void S_NoiseDebug(void)

{
  FSoundChan ***pppFVar1;
  double dVar2;
  long lVar3;
  AActor *actor;
  FSoundChan *pFVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  FSoundChan *pFVar17;
  float fVar18;
  float extraout_XMM0_Da;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  FVector3 origin;
  char temp [32];
  FVector3 local_7c;
  ulong local_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  char local_58 [8];
  undefined1 local_50;
  
  uVar8 = CleanYfac * 0x20;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,10,0,uVar8,"*** SOUND DEBUG INFO ***",0);
  iVar9 = uVar8 + 8;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0,iVar9,"name",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x46,iVar9,"x",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x78,iVar9,"y",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xaa,iVar9,"z",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xdc,iVar9,"vol",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x104,iVar9,"dist",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,300,iVar9,"chan",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x154,iVar9,"pri",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x17c,iVar9,"flags",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x1cc,iVar9,"aud",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x208,iVar9,"pos",0);
  if (Channels != (FSoundChan *)0x0) {
    uVar8 = uVar8 | 0x10;
    lVar3 = (&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    dVar2 = *(double *)(lVar3 + 0x48);
    pFVar4 = Channels;
    do {
      pFVar17 = pFVar4;
      pFVar4 = pFVar17->NextChan;
    } while (pFVar17->NextChan != (FSoundChan *)0x0);
    fStack_64 = (float)*(double *)(lVar3 + 0x50);
    local_68 = (float)*(double *)(lVar3 + 0x58);
    uStack_60 = 0;
    do {
      if ((screen->super_DSimpleCanvas).super_DCanvas.Height + -0x10 <= (int)uVar8) break;
      actor = (pFVar17->field_12).Actor;
      CalcPosVel((uint)pFVar17->SourceType,actor,(sector_t *)actor,(FPolyObj *)actor,
                 (pFVar17->field_12).Point,(uint)pFVar17->EntChannel,pFVar17->ChanFlags,&local_7c,
                 (FVector3 *)0x0);
      iVar9 = ((uint)pFVar17->ChanFlags >> 7 & 2) + 2;
      FWadCollection::GetLumpName(&Wads,local_58,S_sfx.Array[(pFVar17->SoundID).ID].lumpnum);
      local_50 = 0;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0,uVar8,local_58,0);
      if ((pFVar17->ChanFlags & 1) == 0) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x46,uVar8,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x78,uVar8,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0xaa,uVar8,"---",0);
        pcVar6 = "---";
      }
      else {
        mysnprintf(local_58,0x20,"%.0f",(double)local_7c.X);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x46,uVar8,local_58,0);
        mysnprintf(local_58,0x20,"%.0f",(double)local_7c.Z);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x78,uVar8,local_58,0);
        mysnprintf(local_58,0x20,"%.0f",(double)local_7c.Y);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0xaa,uVar8,local_58,0);
        pcVar6 = "---";
        if (0.0 < (pFVar17->super_FISoundChannel).DistanceScale) {
          fVar18 = local_7c.X - (float)dVar2;
          c_sqrt((double)((local_7c.Z - fStack_64) * (local_7c.Z - fStack_64) +
                         fVar18 * fVar18 + (local_7c.Y - local_68) * (local_7c.Y - local_68)));
          mysnprintf(local_58,0x20,"%.0f");
          pcVar6 = local_58;
        }
      }
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x104,uVar8,pcVar6,0);
      mysnprintf(local_58,0x20,"%.2g",(double)pFVar17->Volume);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0xdc,uVar8,local_58,0);
      mysnprintf(local_58,0x20,"%d",(ulong)pFVar17->EntChannel);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,300,uVar8,local_58,0);
      mysnprintf(local_58,0x20,"%d",(ulong)(uint)(int)pFVar17->Priority);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x154,uVar8,local_58,0);
      uVar5 = pFVar17->ChanFlags;
      pcVar6 = "\x1cD";
      pcVar16 = "\x1cD";
      if ((uVar5 & 1) == 0) {
        pcVar16 = "\x1cM";
      }
      auVar20._0_4_ = -(uint)((uVar5 & 0x40) == 0);
      auVar20._4_4_ = -(uint)((uVar5 & 0x10) == 0);
      auVar20._8_4_ = -(uint)((uVar5 & 0x20) == 0);
      auVar20._12_4_ = -(uint)((uVar5 & 8) == 0);
      auVar19._0_4_ = -(uint)((uVar5 & 0x800) == 0);
      auVar19._4_4_ = -(uint)((uVar5 & 2) == 0);
      auVar19._8_4_ = -(uint)((uVar5 & 0x100) == 0);
      auVar19._12_4_ = -(uint)((uVar5 & 0x80) == 0);
      auVar20 = packssdw(auVar19,auVar20);
      auVar20 = packsswb(auVar20,auVar20);
      pcVar12 = "\x1cD";
      if ((auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar12 = "\x1cM";
      }
      pcVar13 = "\x1cD";
      if ((auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "\x1cM";
      }
      pcVar7 = "\x1cD";
      if ((auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar7 = "\x1cM";
      }
      pcVar10 = "\x1cD";
      if ((auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "\x1cM";
      }
      pcVar11 = "\x1cD";
      if ((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar11 = "\x1cM";
      }
      pcVar14 = "\x1cD";
      if ((auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "\x1cM";
      }
      pcVar15 = "\x1cD";
      if ((auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "\x1cM";
      }
      if ((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar6 = "\x1cM";
      }
      local_70 = (ulong)uVar8;
      mysnprintf(local_58,0x20,"%s3%sZ%sU%sM%sN%sA%sL%sE%sV",pcVar16,pcVar12,pcVar13,pcVar7,pcVar10,
                 pcVar11,pcVar14,pcVar15,pcVar6);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x17c,uVar8,local_58,0);
      (*GSnd->_vptr_SoundRenderer[0x14])(GSnd,pFVar17);
      mysnprintf(local_58,0x20,"%.4f",(double)extraout_XMM0_Da);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x1cc,uVar8,local_58,0);
      uVar5 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,pFVar17);
      mysnprintf(local_58,0x20,"%u",(ulong)uVar5);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar9,0x208,uVar8,local_58,0);
      uVar8 = uVar8 + 8;
      pppFVar1 = &pFVar17->PrevChan;
      pFVar17 = (FSoundChan *)(*pppFVar1 + -5);
    } while (*pppFVar1 != &Channels);
    V_SetBorderNeedRefresh();
  }
  return;
}

Assistant:

void S_NoiseDebug (void)
{
	FSoundChan *chan;
	FVector3 listener;
	FVector3 origin;
	int y, color;

	y = 32 * CleanYfac;
	screen->DrawText (SmallFont, CR_YELLOW, 0, y, "*** SOUND DEBUG INFO ***", TAG_DONE);
	y += 8;

	screen->DrawText (SmallFont, CR_GOLD, 0, y, "name", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 70, y, "x", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 120, y, "y", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 170, y, "z", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 220, y, "vol", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 260, y, "dist", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 300, y, "chan", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 340, y, "pri", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 380, y, "flags", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 460, y, "aud", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 520, y, "pos", TAG_DONE);
	y += 8;

	if (Channels == NULL)
	{
		return;
	}


	listener = players[consoleplayer].camera->SoundPos();

	// Display the oldest channel first.
	for (chan = Channels; chan->NextChan != NULL; chan = chan->NextChan)
	{ }
	while (y < SCREENHEIGHT - 16)
	{
		char temp[32];

		CalcPosVel(chan, &origin, NULL);
		color = (chan->ChanFlags & CHAN_LOOP) ? CR_BROWN : CR_GREY;

		// Name
		Wads.GetLumpName (temp, S_sfx[chan->SoundID].lumpnum);
		temp[8] = 0;
		screen->DrawText (SmallFont, color, 0, y, temp, TAG_DONE);

		if (!(chan->ChanFlags & CHAN_IS3D))
		{
			screen->DrawText(SmallFont, color, 70, y, "---", TAG_DONE);		// X
			screen->DrawText(SmallFont, color, 120, y, "---", TAG_DONE);	// Y
			screen->DrawText(SmallFont, color, 170, y, "---", TAG_DONE);	// Z
			screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);	// Distance
		}
		else
		{
			// X coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.X);
			screen->DrawText(SmallFont, color, 70, y, temp, TAG_DONE);

			// Y coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Z);
			screen->DrawText(SmallFont, color, 120, y, temp, TAG_DONE);

			// Z coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Y);
			screen->DrawText(SmallFont, color, 170, y, temp, TAG_DONE);

			// Distance
			if (chan->DistanceScale > 0)
			{
				mysnprintf(temp, countof(temp), "%.0f", (origin - listener).Length());
				screen->DrawText(SmallFont, color, 260, y, temp, TAG_DONE);
			}
			else
			{
				screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);
			}
		}

		// Volume
		mysnprintf(temp, countof(temp), "%.2g", chan->Volume);
		screen->DrawText(SmallFont, color, 220, y, temp, TAG_DONE);

		// Channel
		mysnprintf(temp, countof(temp), "%d", chan->EntChannel);
		screen->DrawText(SmallFont, color, 300, y, temp, TAG_DONE);

		// Priority
		mysnprintf(temp, countof(temp), "%d", chan->Priority);
		screen->DrawText(SmallFont, color, 340, y, temp, TAG_DONE);

		// Flags
		mysnprintf(temp, countof(temp), "%s3%sZ%sU%sM%sN%sA%sL%sE%sV",
			(chan->ChanFlags & CHAN_IS3D)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LISTENERZ)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_UI)				? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_MAYBE_LOCAL)	? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_NOPAUSE)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_AREA)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LOOP)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_EVICTED)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_VIRTUAL)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK);
		screen->DrawText(SmallFont, color, 380, y, temp, TAG_DONE);

		// Audibility
		mysnprintf(temp, countof(temp), "%.4f", GSnd->GetAudibility(chan));
		screen->DrawText(SmallFont, color, 460, y, temp, TAG_DONE);

		// Position
		mysnprintf(temp, countof(temp), "%u", GSnd->GetPosition(chan));
		screen->DrawText(SmallFont, color, 520, y, temp, TAG_DONE);


		y += 8;
		if (chan->PrevChan == &Channels)
		{
			break;
		}
		chan = (FSoundChan *)((size_t)chan->PrevChan - myoffsetof(FSoundChan, NextChan));
	}
	V_SetBorderNeedRefresh();
}